

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

void __thiscall
Matrix<double,_-1,_-1>::SetElement(Matrix<double,__1,__1> *this,int row,int col,double num)

{
  int iVar1;
  ostream *this_00;
  int position;
  double num_local;
  int col_local;
  int row_local;
  Matrix<double,__1,__1> *this_local;
  
  if (-1 < row) {
    iVar1 = Matrix<double,_-1,_-1>::row(this);
    if ((row < iVar1) && (-1 < col)) {
      iVar1 = Matrix<double,_-1,_-1>::col(this);
      if (col < iVar1) {
        this->data[row * this->cols + col] = num;
        return;
      }
    }
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"Assertion occurred! Please check!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void Matrix<Type, _0, _1>::SetElement(const int row, const int col, const Type num) const
{
    if(row < 0 || row >= this->row() ||
       col < 0 || col >= this->col())
    {
        cerr << "Assertion occurred! Please check!" << endl;
        exit(-1);
    }
    int position = row * this->cols + col;
    this->data[position] = num;
}